

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_file_reader_skip(mpack_reader_t *reader,size_t count)

{
  FILE *__stream;
  mpack_error_t mVar1;
  int iVar2;
  long lVar3;
  FILE *file;
  size_t count_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_reader_error(reader);
  if (mVar1 != mpack_ok) {
    return;
  }
  __stream = (FILE *)reader->context;
  lVar3 = ftell(__stream);
  if (-1 < lVar3) {
    iVar2 = fseek(__stream,count,1);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = ferror(__stream);
    if (iVar2 != 0) {
      mpack_reader_flag_error(reader,mpack_error_io);
      return;
    }
  }
  mpack_reader_skip_using_fill(reader,count);
  return;
}

Assistant:

static void mpack_file_reader_skip(mpack_reader_t* reader, size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return;
    FILE* file = (FILE*)reader->context;

    // We call ftell() to test whether the stream is seekable
    // without causing a file error.
    if (ftell(file) >= 0) {
        mpack_log("seeking forward %i bytes\n", (int)count);
        if (fseek(file, (long int)count, SEEK_CUR) == 0)
            return;
        mpack_log("fseek() didn't return zero!\n");
        if (ferror(file)) {
            mpack_reader_flag_error(reader, mpack_error_io);
            return;
        }
    }

    // If the stream is not seekable, fall back to the fill function.
    mpack_reader_skip_using_fill(reader, count);
}